

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_operators.cpp
# Opt level: O1

Matrix<long_double> *
neural_networks::utilities::matrix_operators::multiply
          (Matrix<long_double> *first,NeuralMatrix *other)

{
  size_t sVar1;
  size_t sVar2;
  long lVar3;
  size_t sVar4;
  Matrix<long_double> *this;
  length_error *this_00;
  size_t sVar5;
  size_t sVar6;
  longdouble *plVar7;
  longdouble *plVar8;
  pointer pvVar9;
  size_t sVar10;
  longdouble lVar11;
  
  if (first->M == (other->super_Matrix<neural_networks::utilities::Neuron_*>).N) {
    this = (Matrix<long_double> *)operator_new(0x30);
    Matrix<long_double>::Matrix
              (this,first->N,(other->super_Matrix<neural_networks::utilities::Neuron_*>).M);
    sVar1 = first->N;
    if (sVar1 != 0) {
      sVar2 = (other->super_Matrix<neural_networks::utilities::Neuron_*>).M;
      sVar5 = 0;
      do {
        if (sVar2 != 0) {
          lVar3 = *(long *)&(this->matrix).
                            super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[sVar5].
                            super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
                            super__Vector_impl_data;
          sVar4 = first->M;
          sVar6 = 0;
          do {
            *(longdouble *)(lVar3 + sVar6 * 0x10) = (longdouble)0;
            if (sVar4 != 0) {
              plVar7 = (longdouble *)(sVar6 * 0x10 + lVar3);
              plVar8 = (first->matrix).
                       super__Vector_base<std::vector<long_double,_std::allocator<long_double>_>,_std::allocator<std::vector<long_double,_std::allocator<long_double>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[sVar5].
                       super__Vector_base<long_double,_std::allocator<long_double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              pvVar9 = (other->super_Matrix<neural_networks::utilities::Neuron_*>).matrix.
                       super__Vector_base<std::vector<neural_networks::utilities::Neuron_*,_std::allocator<neural_networks::utilities::Neuron_*>_>,_std::allocator<std::vector<neural_networks::utilities::Neuron_*,_std::allocator<neural_networks::utilities::Neuron_*>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              lVar11 = *plVar7;
              sVar10 = sVar4;
              do {
                lVar11 = *(longdouble *)
                          (*(long *)(*(long *)&(pvVar9->
                                               super__Vector_base<neural_networks::utilities::Neuron_*,_std::allocator<neural_networks::utilities::Neuron_*>_>
                                               )._M_impl.super__Vector_impl_data + sVar6 * 8) + 0x20
                          ) * *plVar8 + lVar11;
                *plVar7 = lVar11;
                plVar8 = plVar8 + 1;
                pvVar9 = pvVar9 + 1;
                sVar10 = sVar10 - 1;
              } while (sVar10 != 0);
            }
            sVar6 = sVar6 + 1;
          } while (sVar6 != sVar2);
        }
        sVar5 = sVar5 + 1;
      } while (sVar5 != sVar1);
    }
    return this;
  }
  this_00 = (length_error *)__cxa_allocate_exception(0x10);
  std::length_error::length_error(this_00,"Dimension mismatch");
  __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
}

Assistant:

Matrix<long double>* matrix_operators::multiply(const Matrix<long double> *first, const NeuralMatrix *other)  {
    if(first -> M == other -> N) {
        Matrix<long double> *product = new Matrix<long double>(first -> N, other -> M);
        if(product == nullptr) {
            return nullptr;
        }
        register size_t i, j, k;
        for(i = 0; i < first -> N; ++i) {
            for(j = 0; j < other -> M; ++j) {
                product -> matrix[i][j] = 0;
                for(k = 0; k < first -> M; ++k) {
                    product -> matrix[i][j] += first -> matrix[i][k] * other -> matrix[k][j] -> function;
                }
            }
        }
        return product;
    } else {
        throw std::length_error("Dimension mismatch");
    }
}